

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkToBarBufs(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtkNew;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  long *plVar6;
  long *plVar7;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pAVar8;
  int i;
  Vec_Ptr_t *vLoMaps;
  Vec_Ptr_t *vLiMaps;
  char Buffer [1000];
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                  ,0xbc,"Abc_Ntk_t *Abc_NtkToBarBufs(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkCheckSingleInstance(pNtk);
  if (iVar1 == 0) {
    pNtkNew = (Abc_Ntk_t *)0x0;
  }
  else {
    if (pNtk->pDesign == (Abc_Des_t *)0x0) {
      __assert_fail("pNtk->pDesign != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                    ,0xbf,"Abc_Ntk_t *Abc_NtkToBarBufs(Abc_Ntk_t *)");
    }
    pNtkNew = Abc_NtkAlloc(ABC_NTK_LOGIC,pNtk->ntkFunc,1);
    pcVar3 = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pName = pcVar3;
    pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
    pNtkNew->pSpec = pcVar3;
    Abc_NtkCleanCopy_rec(pNtk);
    for (iVar1 = 0; iVar1 < pNtk->vPis->nSize; iVar1 = iVar1 + 1) {
      pAVar4 = Abc_NtkPi(pNtk,iVar1);
      pAVar5 = Abc_NtkDupObj(pNtkNew,pAVar4,1);
      *(Abc_Obj_t **)((long)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanouts).pArray] + 0x40) = pAVar5
      ;
    }
    for (iVar1 = 0; iVar1 < pNtk->vPos->nSize; iVar1 = iVar1 + 1) {
      pAVar4 = Abc_NtkPo(pNtk,iVar1);
      Abc_NtkDupObj(pNtkNew,pAVar4,1);
    }
    uVar2 = Abc_NtkCollectPiPos(pNtk,&vLiMaps,&vLoMaps);
    iVar1 = 0;
    while (iVar1 < vLiMaps->nSize) {
      plVar6 = (long *)Vec_PtrEntry(vLiMaps,iVar1);
      plVar7 = (long *)Vec_PtrEntry(vLoMaps,iVar1);
      pAVar4 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_BI);
      pAVar5 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_LATCH);
      pObj = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_BO);
      Abc_ObjAddFanin(pAVar5,pAVar4);
      Abc_ObjAddFanin(pObj,pAVar5);
      pAVar5->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
      pAVar8 = (Abc_Ntk_t *)
               **(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) + (long)*(int *)plVar6[4] * 8);
      if (pAVar8 == pNtk) {
        pAVar8 = (Abc_Ntk_t *)
                 **(long **)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) + (long)*(int *)plVar7[6] * 8)
        ;
        if (pAVar8 == pNtk) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                        ,0xd9,"Abc_Ntk_t *Abc_NtkToBarBufs(Abc_Ntk_t *)");
        }
      }
      sprintf(Buffer,"_%s_in",pAVar8->pName);
      pcVar3 = Abc_ObjName(*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*plVar6 + 0x20) + 8) + (long)*(int *)plVar6[4] * 8)
                          );
      Abc_ObjAssignName(pAVar4,pcVar3,Buffer);
      sprintf(Buffer,"_%s_out",pAVar8->pName);
      pcVar3 = Abc_ObjName(*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*plVar7 + 0x20) + 8) + (long)*(int *)plVar7[6] * 8)
                          );
      Abc_ObjAssignName(pObj,pcVar3,Buffer);
      plVar6[8] = (long)pAVar4;
      *(Abc_Obj_t **)
       (*(long *)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) + (long)*(int *)plVar7[6] * 8) + 0x40) =
           pObj;
      iVar1 = iVar1 + 1;
      if ((*(uint *)(*(long *)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                              (long)*(int *)plVar7[6] * 8) + 0x14) & 0xf) != 6) {
        __assert_fail("Abc_ObjIsNet(Abc_ObjFanout0(pLoMap))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                      ,0xe0,"Abc_Ntk_t *Abc_NtkToBarBufs(Abc_Ntk_t *)");
      }
    }
    Vec_PtrFree(vLiMaps);
    Vec_PtrFree(vLoMaps);
    for (iVar1 = 0; p = pNtk->pDesign->vModules, iVar1 < p->nSize; iVar1 = iVar1 + 1) {
      pAVar8 = (Abc_Ntk_t *)Vec_PtrEntry(p,iVar1);
      for (i = 0; i < pAVar8->vCos->nSize; i = i + 1) {
        pAVar5 = Abc_NtkCo(pAVar8,i);
        pAVar4 = (pAVar5->field_6).pCopy;
        pAVar5 = Abc_NtkToBarBufs_rec
                           (pNtkNew,(Abc_Obj_t *)
                                    pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray]);
        Abc_ObjAddFanin(pAVar4,pAVar5);
      }
    }
    pNtkNew->nBarBufs = pNtkNew->nObjCounts[8];
    printf("Hierarchy reader flattened %d instances of logic boxes and introduced %d barbufs.\n",
           (ulong)uVar2);
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkToBarBufs( Abc_Ntk_t * pNtk )
{
    char Buffer[1000];
    Vec_Ptr_t * vLiMaps, * vLoMaps;
    Abc_Ntk_t * pNtkNew, * pTemp;
    Abc_Obj_t * pLatch, * pObjLi, * pObjLo;
    Abc_Obj_t * pObj, * pLiMap, * pLoMap;
    int i, k, nBoxes;
    assert( Abc_NtkIsNetlist(pNtk) );
    if ( !Abc_NtkCheckSingleInstance(pNtk) )
        return NULL;
    assert( pNtk->pDesign != NULL );
    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, pNtk->ntkFunc, 1 );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clone CIs/CIs/boxes
    Abc_NtkCleanCopy_rec( pNtk );
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_ObjFanout0(pObj)->pCopy = Abc_NtkDupObj( pNtkNew, pObj, 1 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    // create latches and transfer copy labels
    nBoxes = Abc_NtkCollectPiPos( pNtk, &vLiMaps, &vLoMaps );
    Vec_PtrForEachEntryTwo( Abc_Obj_t *, vLiMaps, Abc_Obj_t *, vLoMaps, pLiMap, pLoMap, i )
    {
        pObjLi = Abc_NtkCreateBi(pNtkNew);
        pLatch = Abc_NtkCreateLatch(pNtkNew);
        pObjLo = Abc_NtkCreateBo(pNtkNew);
        Abc_ObjAddFanin( pLatch, pObjLi );
        Abc_ObjAddFanin( pObjLo, pLatch );
        pLatch->pData = (void *)ABC_INIT_ZERO;
        pTemp = NULL;
        if ( Abc_ObjFanin0(pLiMap)->pNtk != pNtk )
            pTemp = Abc_ObjFanin0(pLiMap)->pNtk;
        else if ( Abc_ObjFanout0(pLoMap)->pNtk != pNtk )
            pTemp = Abc_ObjFanout0(pLoMap)->pNtk;
        else assert( 0 );
        sprintf( Buffer, "_%s_in", Abc_NtkName(pTemp) );
        Abc_ObjAssignName( pObjLi, Abc_ObjName(Abc_ObjFanin0(pLiMap)), Buffer );
        sprintf( Buffer, "_%s_out", Abc_NtkName(pTemp) );
        Abc_ObjAssignName( pObjLo, Abc_ObjName(Abc_ObjFanout0(pLoMap)), Buffer );
        pLiMap->pCopy = pObjLi;
        Abc_ObjFanout0(pLoMap)->pCopy = pObjLo;
        assert( Abc_ObjIsNet(Abc_ObjFanout0(pLoMap)) );
    }
    Vec_PtrFree( vLiMaps );
    Vec_PtrFree( vLoMaps );
    // rebuild networks
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pTemp, i )
        Abc_NtkForEachCo( pTemp, pObj, k )
            Abc_ObjAddFanin( pObj->pCopy, Abc_NtkToBarBufs_rec(pNtkNew, Abc_ObjFanin0(pObj)) );
    pNtkNew->nBarBufs = Abc_NtkLatchNum(pNtkNew);
    printf( "Hierarchy reader flattened %d instances of logic boxes and introduced %d barbufs.\n", nBoxes, pNtkNew->nBarBufs );
    return pNtkNew;
}